

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O2

qsizetype indexOf_helper<QLatin1String>
                    (QStringList *that,QLatin1String needle,qsizetype from,CaseSensitivity cs)

{
  long lVar1;
  QString *pQVar2;
  int iVar3;
  ulong uVar4;
  P _a;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QStringView other;
  QLatin1String needle_local;
  
  needle_local.m_data = needle.m_data;
  needle_local.m_size = needle.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (that->d).size;
  uVar5 = from;
  if (from < 0) {
    uVar5 = from + uVar4;
    if ((long)(from + uVar4) < 1) {
      uVar5 = 0;
    }
  }
  uVar7 = 0xffffffffffffffff;
  if (uVar5 < uVar4) {
    lVar6 = uVar5 * 0x18 + 0x10;
    while ((uVar7 = 0xffffffffffffffff, uVar5 < uVar4 &&
           (pQVar2 = (that->d).ptr,
           other.m_data = *(storage_type_conflict **)((long)pQVar2 + lVar6 + -8),
           other.m_size = *(qsizetype *)((long)&(pQVar2->d).d + lVar6),
           iVar3 = QLatin1String::compare(&needle_local,other,cs), uVar7 = uVar5, iVar3 != 0))) {
      uVar5 = uVar5 + 1;
      uVar4 = (that->d).size;
      lVar6 = lVar6 + 0x18;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar7;
}

Assistant:

qsizetype indexOf_helper(const QStringList &that, String needle, qsizetype from,
                         Qt::CaseSensitivity cs)
{
    if (from < 0) // Historical behavior
        from = qMax(from + that.size(), 0);

    if (from >= that.size())
        return -1;

    for (qsizetype i = from; i < that.size(); ++i) {
        if (needle.compare(that.at(i), cs) == 0)
            return i;
    }
    return -1;
}